

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

bool __thiscall inja::Parser::parse_expression_datum(Parser *this,Template *tmpl)

{
  Token *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pBVar3;
  undefined4 uVar4;
  size_type sVar5;
  bool bVar6;
  Op op;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  FunctionData *pFVar10;
  long *plVar11;
  size_type *psVar12;
  size_t sVar13;
  uint num_args;
  long lVar14;
  long lVar15;
  const_pointer pcVar16;
  pointer pcVar17;
  string_view name;
  string_view name_00;
  undefined1 local_100 [8];
  json_value jStack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  string local_e0;
  Lexer *local_c0;
  const_pointer local_b8;
  Template *local_b0;
  Token *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  size_type local_80;
  string local_78;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  this_00 = &this->m_tok;
  local_c0 = &this->m_lexer;
  local_a8 = &this->m_peek_tok;
  local_b8 = (const_pointer)0x0;
  lVar15 = 0;
  lVar14 = 0;
  local_b0 = tmpl;
  do {
    pcVar17 = local_100 + 0x10;
    switch(this_00->kind) {
    case Id:
      if (this->m_have_peek_tok == false) {
        Lexer::scan((Token *)local_100,local_c0);
        (local_a8->text).size_ = local_f0._M_allocated_capacity;
        *(undefined1 (*) [8])local_a8 = local_100;
        (local_a8->text).data_ = (const_pointer)jStack_f8;
        this->m_have_peek_tok = true;
      }
      if ((this->m_peek_tok).kind == LeftParen) {
        local_b8 = (this->m_tok).text.data_;
        local_80 = (this->m_tok).text.size_;
        if (this->m_have_peek_tok == true) {
          (this->m_tok).text.size_ = (local_a8->text).size_;
          uVar4 = *(undefined4 *)&local_a8->field_0x4;
          pcVar16 = (local_a8->text).data_;
          this_00->kind = local_a8->kind;
          *(undefined4 *)&this_00->field_0x4 = uVar4;
          (this->m_tok).text.data_ = pcVar16;
          this->m_have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)local_100,local_c0);
          (this->m_tok).text.size_ = local_f0._M_allocated_capacity;
          *(undefined1 (*) [8])this_00 = local_100;
          (this->m_tok).text.data_ = (const_pointer)jStack_f8;
        }
        paVar1 = &local_e0.field_2;
        if (this->m_have_peek_tok == true) {
          (this->m_tok).text.size_ = (local_a8->text).size_;
          uVar4 = *(undefined4 *)&local_a8->field_0x4;
          pcVar16 = (local_a8->text).data_;
          this_00->kind = local_a8->kind;
          *(undefined4 *)&this_00->field_0x4 = uVar4;
          (this->m_tok).text.data_ = pcVar16;
          this->m_have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)local_100,local_c0);
          (this->m_tok).text.size_ = local_f0._M_allocated_capacity;
          *(undefined1 (*) [8])this_00 = local_100;
          (this->m_tok).text.data_ = (const_pointer)jStack_f8;
        }
        if (this_00->kind != RightParen) {
          num_args = 1;
          goto LAB_001949a7;
        }
        if (this->m_have_peek_tok == true) {
          (this->m_tok).text.size_ = (local_a8->text).size_;
          uVar4 = *(undefined4 *)&local_a8->field_0x4;
          pcVar16 = (local_a8->text).data_;
          this_00->kind = local_a8->kind;
          *(undefined4 *)&this_00->field_0x4 = uVar4;
          (this->m_tok).text.data_ = pcVar16;
          this->m_have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)local_100,local_c0);
          (this->m_tok).text.size_ = local_f0._M_allocated_capacity;
          *(undefined1 (*) [8])this_00 = local_100;
          (this->m_tok).text.data_ = (const_pointer)jStack_f8;
        }
        num_args = 0;
        goto LAB_00194d01;
      }
      uVar2 = (this->m_tok).text.size_;
      if (uVar2 == 0) {
LAB_00194695:
        local_e0._M_dataplus._M_p._0_1_ = 3;
        local_100 = (undefined1  [8])
                    (CONCAT44(local_100._4_4_,(uint)(this->m_config->notation == Pointer)) | 2);
        std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
        emplace_back<inja::Bytecode::Op,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&,inja::Bytecode::Flag>
                  ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)local_b0,(Op *)&local_e0
                   ,&(this->m_tok).text,(Flag *)local_100);
        goto LAB_001946c1;
      }
      pcVar16 = (this->m_tok).text.data_;
      sVar13 = 4;
      if (uVar2 < 4) {
        sVar13 = uVar2;
      }
      iVar7 = bcmp(pcVar16,"true",sVar13);
      if ((uVar2 != 4) || (iVar7 != 0)) {
        sVar13 = 5;
        if (uVar2 < 5) {
          sVar13 = uVar2;
        }
        iVar7 = bcmp(pcVar16,"false",sVar13);
        if ((uVar2 != 5) || (iVar7 != 0)) {
          sVar13 = 4;
          if (uVar2 < 4) {
            sVar13 = uVar2;
          }
          iVar7 = bcmp(pcVar16,"null",sVar13);
          if ((uVar2 != 4) || (iVar7 != 0)) goto LAB_00194695;
        }
      }
      if (lVar15 == 0 && lVar14 == 0) goto LAB_001945e7;
      break;
    case Number:
    case String:
      if (lVar15 != 0 || lVar14 != 0) break;
      pcVar16 = (this->m_tok).text.data_;
      goto LAB_001945e7;
    case Comma:
    case Colon:
      if (lVar15 == 0 && lVar14 == 0) {
        local_100 = (undefined1  [8])pcVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
        Token::describe_abi_cxx11_(&local_78,this_00);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x43dee2);
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_90 = *plVar11;
          lStack_88 = plVar8[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar11;
          local_a0 = (long *)*plVar8;
        }
        local_98 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_e0.field_2._M_allocated_capacity = *psVar12;
          local_e0.field_2._8_8_ = plVar8[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar12;
          local_e0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_e0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        inja_throw((string *)local_100,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_))
          ;
        }
        if (local_100 != (undefined1  [8])pcVar17) {
          operator_delete((void *)local_100);
        }
        lVar15 = 0;
        lVar14 = 0;
      }
      break;
    case LeftParen:
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
        uVar4 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
        pcVar16 = (this->m_peek_tok).text.data_;
        this_00->kind = (this->m_peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar4;
        (this->m_tok).text.data_ = pcVar16;
        this->m_have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_100,local_c0);
        (this->m_tok).text.size_ = local_f0._M_allocated_capacity;
        *(undefined1 (*) [8])this_00 = local_100;
        (this->m_tok).text.data_ = (const_pointer)jStack_f8;
      }
      bVar6 = parse_expression(this,local_b0);
      if (!bVar6) {
        return false;
      }
      if (this_00->kind != RightParen) {
        local_100 = (undefined1  [8])pcVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"unmatched \'(\'","");
        inja_throw((string *)local_100,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if (local_100 != (undefined1  [8])pcVar17) {
          operator_delete((void *)local_100);
        }
      }
LAB_001946c1:
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
        uVar4 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
        pcVar16 = (this->m_peek_tok).text.data_;
        this_00->kind = (this->m_peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar4;
        (this->m_tok).text.data_ = pcVar16;
        this->m_have_peek_tok = false;
        return true;
      }
      Lexer::scan((Token *)local_100,local_c0);
      (this->m_tok).text.size_ = local_f0._M_allocated_capacity;
      *(undefined1 (*) [8])this_00 = local_100;
      (this->m_tok).text.data_ = (const_pointer)jStack_f8;
      return true;
    default:
      paVar1 = &local_e0.field_2;
      if (lVar15 != 0) {
        local_100 = (undefined1  [8])pcVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
        local_e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"unmatched \'{\'","");
        inja_throw((string *)local_100,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if (local_100 != (undefined1  [8])pcVar17) {
          operator_delete((void *)local_100);
        }
      }
      if (lVar14 == 0) {
        return false;
      }
      local_100 = (undefined1  [8])pcVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"unmatched \'[\'","");
      inja_throw((string *)local_100,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if (local_100 == (undefined1  [8])pcVar17) {
        return false;
      }
      operator_delete((void *)local_100);
      return false;
    case LeftBracket:
      if (lVar15 == 0 && lVar14 == 0) {
        local_b8 = (this->m_tok).text.data_;
      }
      lVar14 = lVar14 + 1;
      break;
    case RightBracket:
      if (lVar14 == 0) {
        local_100 = (undefined1  [8])pcVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"unexpected \']\'","");
        inja_throw((string *)local_100,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if (local_100 != (undefined1  [8])pcVar17) {
          operator_delete((void *)local_100);
        }
      }
      lVar14 = lVar14 + -1;
      goto LAB_001944b5;
    case LeftBrace:
      if (lVar15 == 0 && lVar14 == 0) {
        local_b8 = (this->m_tok).text.data_;
      }
      lVar15 = lVar15 + 1;
      break;
    case RightBrace:
      if (lVar15 == 0) {
        local_100 = (undefined1  [8])pcVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"unexpected \'}\'","");
        inja_throw((string *)local_100,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if (local_100 != (undefined1  [8])pcVar17) {
          operator_delete((void *)local_100);
        }
      }
      lVar15 = lVar15 + -1;
LAB_001944b5:
      pcVar16 = local_b8;
      if (lVar15 == 0 && lVar14 == 0) {
LAB_001945e7:
        local_78._M_dataplus._M_p._0_1_ = 3;
        nlohmann::detail::input_adapter::input_adapter<const_char_*,_0>
                  ((input_adapter *)&local_e0,pcVar16,
                   (this->m_tok).text.data_ + (this->m_tok).text.size_);
        local_48 = (code *)0x0;
        uStack_40 = 0;
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_100,(input_adapter *)&local_e0,(parser_callback_t *)&local_58,true);
        local_a0 = (long *)CONCAT44(local_a0._4_4_,1);
        std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
        emplace_back<inja::Bytecode::Op,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,inja::Bytecode::Flag>
                  ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)local_b0,(Op *)&local_78
                   ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_100,(Flag *)&local_a0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_100);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_100 + 8),(value_t)local_100[0]);
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,__destroy_functor);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_string_length);
        }
        goto LAB_001946c1;
      }
    }
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text.size_ = (local_a8->text).size_;
      uVar4 = *(undefined4 *)&local_a8->field_0x4;
      pcVar16 = (local_a8->text).data_;
      this_00->kind = local_a8->kind;
      *(undefined4 *)&this_00->field_0x4 = uVar4;
      (this->m_tok).text.data_ = pcVar16;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)local_100,local_c0);
      (this->m_tok).text.size_ = local_f0._M_allocated_capacity;
      *(undefined1 (*) [8])this_00 = local_100;
      (this->m_tok).text.data_ = (const_pointer)jStack_f8;
    }
  } while( true );
LAB_001949a7:
  bVar6 = parse_expression(this,local_b0);
  if (!bVar6) {
    local_100 = (undefined1  [8])pcVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
    Token::describe_abi_cxx11_(&local_78,this_00);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x43de88);
    local_a0 = &local_90;
    plVar8 = puVar9 + 2;
    if ((long *)*puVar9 == plVar8) {
      local_90 = *plVar8;
      lStack_88 = puVar9[3];
    }
    else {
      local_90 = *plVar8;
      local_a0 = (long *)*puVar9;
    }
    local_98 = puVar9[1];
    *puVar9 = plVar8;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_e0.field_2._M_allocated_capacity = *psVar12;
      local_e0.field_2._8_8_ = puVar9[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar12;
      local_e0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_e0._M_string_length = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    inja_throw((string *)local_100,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_));
    }
    if (local_100 != (undefined1  [8])pcVar17) {
      operator_delete((void *)local_100);
    }
  }
  if (this_00->kind != Comma) {
    if (this_00->kind == RightParen) {
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (local_a8->text).size_;
        uVar4 = *(undefined4 *)&local_a8->field_0x4;
        pcVar16 = (local_a8->text).data_;
        this_00->kind = local_a8->kind;
        *(undefined4 *)&this_00->field_0x4 = uVar4;
        (this->m_tok).text.data_ = pcVar16;
        this->m_have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_100,local_c0);
        (this->m_tok).text.size_ = local_f0._M_allocated_capacity;
        *(undefined1 (*) [8])this_00 = local_100;
        (this->m_tok).text.data_ = (const_pointer)jStack_f8;
      }
LAB_00194d01:
      sVar5 = local_80;
      pcVar16 = local_b8;
      name_00.size_ = local_80;
      name_00.data_ = local_b8;
      pFVar10 = FunctionStorage::get(&this->m_static->functions,name_00,num_args);
      if (pFVar10 == (FunctionData *)0x0) {
        op = Nop;
      }
      else {
        op = pFVar10->op;
      }
      if (op == Nop) {
        name.size_ = sVar5;
        name.data_ = pcVar16;
        append_callback(this,local_b0,name,num_args);
      }
      else {
        if (op == Default) {
          pBVar3 = (local_b0->bytecodes).
                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          std::swap<inja::Bytecode>(pBVar3 + -1,pBVar3 + -2);
        }
        append_function(this,local_b0,op,num_args);
      }
      return true;
    }
    local_100 = (undefined1  [8])pcVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
    Token::describe_abi_cxx11_(&local_78,this_00);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x44092a);
    local_a0 = &local_90;
    plVar8 = puVar9 + 2;
    if ((long *)*puVar9 == plVar8) {
      local_90 = *plVar8;
      lStack_88 = puVar9[3];
    }
    else {
      local_90 = *plVar8;
      local_a0 = (long *)*puVar9;
    }
    local_98 = puVar9[1];
    *puVar9 = plVar8;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_e0.field_2._M_allocated_capacity = *psVar12;
      local_e0.field_2._8_8_ = puVar9[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar12;
      local_e0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_e0._M_string_length = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    inja_throw((string *)local_100,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_));
    }
    if (local_100 != (undefined1  [8])pcVar17) {
      operator_delete((void *)local_100);
    }
  }
  if (this->m_have_peek_tok == true) {
    (this->m_tok).text.size_ = (local_a8->text).size_;
    uVar4 = *(undefined4 *)&local_a8->field_0x4;
    pcVar16 = (local_a8->text).data_;
    this_00->kind = local_a8->kind;
    *(undefined4 *)&this_00->field_0x4 = uVar4;
    (this->m_tok).text.data_ = pcVar16;
    this->m_have_peek_tok = false;
  }
  else {
    Lexer::scan((Token *)local_100,local_c0);
    (this->m_tok).text.size_ = local_f0._M_allocated_capacity;
    *(undefined1 (*) [8])this_00 = local_100;
    (this->m_tok).text.data_ = (const_pointer)jStack_f8;
  }
  num_args = num_args + 1;
  goto LAB_001949a7;
}

Assistant:

bool parse_expression_datum(Template& tmpl) {
		nonstd::string_view json_first;
		size_t bracket_level = 0;
		size_t brace_level = 0;

		for (;;) {
			switch (m_tok.kind) {
				case Token::Kind::LeftParen: {
					get_next_token();
					if (!parse_expression(tmpl)) return false;
					if (m_tok.kind != Token::Kind::RightParen) {
						inja_throw("parser_error", "unmatched '('");
					}
					get_next_token();
					return true;
				}
				case Token::Kind::Id:
					get_peek_token();
					if (m_peek_tok.kind == Token::Kind::LeftParen) {
						// function call, parse arguments
						Token func_token = m_tok;
						get_next_token();  // id
						get_next_token();  // leftParen
						unsigned int num_args = 0;
						if (m_tok.kind == Token::Kind::RightParen) {
							// no args
							get_next_token();
						} else {
							for (;;) {
								if (!parse_expression(tmpl)) {
									inja_throw("parser_error", "expected expression, got '" + m_tok.describe() + "'");
								}
								num_args += 1;
								if (m_tok.kind == Token::Kind::RightParen) {
									get_next_token();
									break;
								}
								if (m_tok.kind != Token::Kind::Comma) {
									inja_throw("parser_error", "expected ')' or ',', got '" + m_tok.describe() + "'");
								}
								get_next_token();
							}
						}

						auto op = m_static.functions.find_builtin(func_token.text, num_args);

						if (op != Bytecode::Op::Nop) {
							// swap arguments for default(); see comment in RenderTo()
							if (op == Bytecode::Op::Default)
								std::swap(tmpl.bytecodes.back(), *(tmpl.bytecodes.rbegin() + 1));
							append_function(tmpl, op, num_args);
							return true;
						} else {
							append_callback(tmpl, func_token.text, num_args);
							return true;
						}
					} else if (m_tok.text == "true" || m_tok.text == "false" || m_tok.text == "null") {
						// true, false, null are json literals
						if (brace_level == 0 && bracket_level == 0) {
							json_first = m_tok.text;
							goto returnJson;
						}
						break;
					} else {
						// normal literal (json read)
						tmpl.bytecodes.emplace_back(Bytecode::Op::Push, m_tok.text,
													m_config.notation == ElementNotation::Pointer
														? Bytecode::Flag::ValueLookupPointer
														: Bytecode::Flag::ValueLookupDot);
						get_next_token();
						return true;
					}
				// json passthrough
				case Token::Kind::Number:
				case Token::Kind::String:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
						goto returnJson;
					}
					break;
				case Token::Kind::Comma:
				case Token::Kind::Colon:
					if (brace_level == 0 && bracket_level == 0) {
						inja_throw("parser_error", "unexpected token '" + m_tok.describe() + "'");
					}
					break;
				case Token::Kind::LeftBracket:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
					}
					bracket_level += 1;
					break;
				case Token::Kind::LeftBrace:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
					}
					brace_level += 1;
					break;
				case Token::Kind::RightBracket:
					if (bracket_level == 0) {
						inja_throw("parser_error", "unexpected ']'");
					}
					--bracket_level;
					if (brace_level == 0 && bracket_level == 0) goto returnJson;
					break;
				case Token::Kind::RightBrace:
					if (brace_level == 0) {
						inja_throw("parser_error", "unexpected '}'");
					}
					--brace_level;
					if (brace_level == 0 && bracket_level == 0) goto returnJson;
					break;
				default:
					if (brace_level != 0) {
						inja_throw("parser_error", "unmatched '{'");
					}
					if (bracket_level != 0) {
						inja_throw("parser_error", "unmatched '['");
					}
					return false;
			}

			get_next_token();
		}

	returnJson:
		// bridge across all intermediate tokens
		nonstd::string_view json_text(json_first.data(), m_tok.text.data() - json_first.data() + m_tok.text.size());
		tmpl.bytecodes.emplace_back(Bytecode::Op::Push, json::parse(json_text), Bytecode::Flag::ValueImmediate);
		get_next_token();
		return true;
	}